

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 10_create_string.cpp
# Opt level: O1

char * create_by_char(char ch,int size)

{
  uint uVar1;
  char *pcVar2;
  ulong uVar3;
  char cVar4;
  
  uVar1 = 0xffffffff;
  if (-2 < size) {
    uVar1 = size + 1U;
  }
  pcVar2 = (char *)operator_new__((long)(int)uVar1);
  if (-1 < size) {
    uVar3 = 0;
    do {
      cVar4 = '\0';
      if (uVar3 < (uint)size) {
        cVar4 = ch;
      }
      pcVar2[uVar3] = cVar4;
      uVar3 = uVar3 + 1;
    } while (size + 1U != uVar3);
  }
  return pcVar2;
}

Assistant:

char * create_by_char(char ch, int size)
{
    //  使用 new 创建指定长度字符串，最后一位填充为 '\0'
    char *str = new char[size + 1];
    for(int i = 0; i <= size; i++) {
        if (i < size) {
            // 每个字符指向的地址
            str[i] = ch;
        } else {
            str[i] = '\0';
        }
    }
    //  返回指针
    return str;
}